

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

int __thiscall google::protobuf::EnumOptions::ByteSize(EnumOptions *this)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  uVar2 = 0;
  if ((char)this->_has_bits_[0] != '\0') {
    uVar2 = this->_has_bits_[0] * 2 & 2;
  }
  iVar4 = uVar2 + iVar3 * 2;
  if (0 < iVar3) {
    lVar5 = 0;
    do {
      uVar2 = UninterpretedOption::ByteSize
                        ((UninterpretedOption *)
                         (this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_[lVar5]);
      iVar3 = 1;
      if (0x7f < uVar2) {
        iVar3 = io::CodedOutputStream::VarintSize32Fallback(uVar2);
      }
      iVar4 = iVar4 + uVar2 + iVar3;
      lVar5 = lVar5 + 1;
    } while (lVar5 < (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar3 = internal::ExtensionSet::ByteSize(&this->_extensions_);
  iVar3 = iVar3 + iVar4;
  pvVar1 = (this->_unknown_fields_).fields_;
  if ((pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar4 = internal::WireFormat::ComputeUnknownFieldsSize(&this->_unknown_fields_);
    iVar3 = iVar3 + iVar4;
  }
  this->_cached_size_ = iVar3;
  return iVar3;
}

Assistant:

int EnumOptions::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    // optional bool allow_alias = 2 [default = true];
    if (has_allow_alias()) {
      total_size += 1 + 1;
    }

  }
  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  total_size += 2 * this->uninterpreted_option_size();
  for (int i = 0; i < this->uninterpreted_option_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->uninterpreted_option(i));
  }

  total_size += _extensions_.ByteSize();

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}